

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPUDPv4Transmitter::SetMulticastTTL(RTPUDPv4Transmitter *this,uint8_t ttl)

{
  int iVar1;
  bool bVar2;
  int ttl2;
  undefined1 local_14 [4];
  
  bVar2 = false;
  iVar1 = setsockopt(this->rtpsock,0,0x21,local_14,4);
  if (iVar1 == 0) {
    if ((this->rtpsock != this->rtcpsock) &&
       (iVar1 = setsockopt(this->rtcpsock,0,0x21,local_14,4), iVar1 != 0)) {
      return false;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool RTPUDPv4Transmitter::SetMulticastTTL(uint8_t ttl)
{
	int ttl2,status;

	ttl2 = (int)ttl;
	status = setsockopt(rtpsock,IPPROTO_IP,IP_MULTICAST_TTL,(const char *)&ttl2,sizeof(int));
	if (status != 0)
		return false;

	if (rtpsock != rtcpsock) // no need to set TTL twice when multiplexing
	{
		status = setsockopt(rtcpsock,IPPROTO_IP,IP_MULTICAST_TTL,(const char *)&ttl2,sizeof(int));
		if (status != 0)
			return false;
	}
	return true;
}